

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
presolve::HighsPostsolveStack::getReducedPrimalSolution
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,HighsPostsolveStack *this
          ,vector<double,_std::allocator<double>_> *origPrimalSolution)

{
  pointer pcVar1;
  double *pdVar2;
  pointer ppVar3;
  unsigned_long uVar4;
  pointer pcVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  size_type __new_size;
  long lVar9;
  pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long> *primalColTransformation;
  pointer ppVar10;
  DuplicateColumn duplicateColReduction;
  undefined1 local_68 [64];
  
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,origPrimalSolution);
  ppVar3 = (this->reductions).
           super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar10 = (this->reductions).
                 super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar10 != ppVar3; ppVar10 = ppVar10 + 1
      ) {
    if (ppVar10->first == kLinearTransform) {
      uVar4 = ppVar10->second;
      (this->reductionValues).position = uVar4 - 0x18;
      pcVar1 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_68._16_8_ = *(undefined8 *)(pcVar1 + (uVar4 - 8));
      pdVar2 = (double *)(pcVar1 + (uVar4 - 0x18));
      local_68._0_8_ = *pdVar2;
      local_68._8_8_ = pdVar2[1];
      LinearTransform::transformToPresolvedSpace((LinearTransform *)local_68,__return_storage_ptr__)
      ;
    }
    else if (ppVar10->first == kDuplicateColumn) {
      uVar4 = ppVar10->second;
      (this->reductionValues).position = uVar4 - 0x38;
      pcVar5 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar1 = pcVar5 + (uVar4 - 8);
      local_68[0x30] = (bool)pcVar1[0];
      local_68[0x31] = (bool)pcVar1[1];
      local_68[0x32] = pcVar1[2];
      local_68[0x33] = pcVar1[3];
      local_68[0x34] = pcVar1[4];
      local_68[0x35] = pcVar1[5];
      local_68[0x36] = pcVar1[6];
      local_68[0x37] = pcVar1[7];
      local_68._0_8_ = *(undefined8 *)(pcVar5 + (uVar4 - 0x38));
      local_68._8_8_ = *(double *)((long)(pcVar5 + (uVar4 - 0x38)) + 8);
      local_68._16_8_ = *(undefined8 *)(pcVar5 + (uVar4 - 0x28));
      local_68._24_8_ = *(double *)((long)(pcVar5 + (uVar4 - 0x28)) + 8);
      local_68._32_8_ = *(undefined8 *)(pcVar5 + (uVar4 - 0x18));
      local_68._40_8_ = *(double *)((long)(pcVar5 + (uVar4 - 0x18)) + 8);
      DuplicateColumn::transformToPresolvedSpace((DuplicateColumn *)local_68,__return_storage_ptr__)
      ;
    }
  }
  piVar6 = (this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = (this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __new_size = (long)piVar7 - (long)piVar6 >> 2;
  if (piVar7 != piVar6) {
    pdVar8 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    do {
      pdVar8[lVar9] = pdVar8[piVar6[lVar9]];
      lVar9 = lVar9 + 1;
    } while (__new_size + (__new_size == 0) != lVar9);
  }
  std::vector<double,_std::allocator<double>_>::resize(__return_storage_ptr__,__new_size);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> getReducedPrimalSolution(
      const std::vector<double>& origPrimalSolution) {
    std::vector<double> reducedSolution = origPrimalSolution;

    for (const std::pair<ReductionType, size_t>& primalColTransformation :
         reductions) {
      switch (primalColTransformation.first) {
        case ReductionType::kDuplicateColumn: {
          DuplicateColumn duplicateColReduction;
          reductionValues.setPosition(primalColTransformation.second);
          reductionValues.pop(duplicateColReduction);
          duplicateColReduction.transformToPresolvedSpace(reducedSolution);
          break;
        }
        case ReductionType::kLinearTransform: {
          reductionValues.setPosition(primalColTransformation.second);
          LinearTransform linearTransform;
          reductionValues.pop(linearTransform);
          linearTransform.transformToPresolvedSpace(reducedSolution);
          break;
        }
        default:
          continue;
      }
    }

    size_t reducedNumCol = origColIndex.size();
    for (size_t i = 0; i < reducedNumCol; ++i)
      reducedSolution[i] = reducedSolution[origColIndex[i]];

    reducedSolution.resize(reducedNumCol);
    return reducedSolution;
  }